

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_base.h
# Opt level: O2

void * density::detail::
       LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
       ::get_element(LfQueueControl *i_control,bool i_is_external)

{
  uintptr_t uint_pointer;
  void *pvVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,i_is_external) != 0) {
    return (void *)i_control[2].m_next;
  }
  pvVar1 = address_upper_align(i_control + 2,*(size_t *)(i_control[1].m_next + 0x20));
  return pvVar1;
}

Assistant:

static void * get_element(detail::LfQueueControl * i_control, bool i_is_external)
            {
                auto result = address_add(i_control, s_element_min_offset);
                if (i_is_external)
                {
                    /* i_control and s_element_min_offset are aligned to
                       alignof(ExternalBlock), so we don't need to align further */
                    result = static_cast<ExternalBlock *>(result)->m_block;
                }
                else
                {
                    result =
                      address_upper_align(result, type_after_control(i_control)->alignment());
                }
                return result;
            }